

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

void checkerror(int rtperr)

{
  ostream *poVar1;
  int errcode;
  string local_30;
  uint local_c;
  int rtperr_local;
  
  if (rtperr < 0) {
    local_c = rtperr;
    poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: ");
    jrtplib::RTPGetErrorString_abi_cxx11_(&local_30,(jrtplib *)(ulong)local_c,errcode);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    exit(-1);
  }
  return;
}

Assistant:

void checkerror(int rtperr)
{
	if (rtperr < 0)
	{
		std::cout << "ERROR: " << RTPGetErrorString(rtperr) << std::endl;
		exit(-1);
	}
}